

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,TPZMaterialData *data)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  TPZGeoEl *newCols;
  TPZGeoNode *this_00;
  long *plVar4;
  undefined4 extraout_var;
  uint *puVar5;
  double *pdVar6;
  long in_RSI;
  TPZManVector<std::pair<int,_long>,_20> *in_RDI;
  int ish;
  int nvec_shape;
  TPZShapeData *shapedata;
  int i_2;
  int i_1;
  int i;
  TPZGeoEl *gel;
  TPZShapeData *in_stack_000000b8;
  TPZManVector<int,_4> sideorient;
  TPZManVector<int,_15> orders;
  TPZManVector<long,_4> ids;
  int in_stack_fffffffffffffe4c;
  TPZShapeData *in_stack_fffffffffffffe50;
  TPZCompEl *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  TPZFMatrix<double> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  TPZManVector<int,_15> *in_stack_fffffffffffffe80;
  TPZFMatrix<double> *in_stack_fffffffffffffec8;
  int local_128;
  int local_124;
  long local_120;
  int local_114;
  uint local_110;
  int local_10c;
  TPZGeoEl *local_108;
  undefined4 local_fc;
  TPZVec<int> local_f8 [2];
  undefined4 local_b4;
  TPZShapeData *in_stack_ffffffffffffff58;
  TPZVec<int> *in_stack_ffffffffffffff60;
  TPZVec<int> *in_stack_ffffffffffffff68;
  TPZVec<long> *in_stack_ffffffffffffff70;
  TPZVec<long> local_50 [2];
  long local_10;
  
  local_10 = in_RSI;
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_b4 = 0;
  TPZManVector<int,_15>::TPZManVector
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,(int *)in_stack_fffffffffffffe70);
  local_fc = 0;
  TPZManVector<int,_4>::TPZManVector
            ((TPZManVector<int,_4> *)in_stack_fffffffffffffe80,
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (int *)in_stack_fffffffffffffe70);
  newCols = TPZCompEl::Reference(in_stack_fffffffffffffe58);
  local_108 = newCols;
  for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
    this_00 = TPZGeoEl::NodePtr((TPZGeoEl *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    iVar2 = TPZGeoNode::Id(this_00);
    plVar4 = TPZVec<long>::operator[](local_50,(long)local_10c);
    *plVar4 = (long)iVar2;
  }
  for (local_110 = 0; (int)local_110 < 5; local_110 = local_110 + 1) {
    iVar2 = (*(in_RDI->super_TPZVec<std::pair<int,_long>_>)._vptr_TPZVec[0x15])
                      (in_RDI,(ulong)local_110);
    bVar1 = TPZConnect::Order((TPZConnect *)CONCAT44(extraout_var,iVar2));
    uVar3 = (uint)bVar1;
    puVar5 = (uint *)TPZVec<int>::operator[]
                               ((TPZVec<int> *)&stack0xffffffffffffff50,(long)(int)local_110);
    *puVar5 = uVar3;
  }
  for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
    iVar2 = SideOrient((TPZCompElHDiv<pzshape::TPZShapeTetra> *)in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c);
    in_stack_fffffffffffffe70 =
         (TPZFMatrix<double> *)TPZVec<int>::operator[](local_f8,(long)local_114);
    *(int *)&((TPZVec<long> *)&in_stack_fffffffffffffe70->super_TPZMatrix<double>)->_vptr_TPZVec =
         iVar2;
  }
  local_120 = local_10;
  local_124 = 0;
  iVar2 = (int)in_RDI->fExtAlloc[0xb].second;
  if (iVar2 == 0) {
    TPZShapeHDiv<pzshape::TPZShapeTetra>::Initialize
              ((TPZVec<long> *)sideorient.super_TPZVec<int>.fNElements,
               (TPZVec<int> *)sideorient.super_TPZVec<int>.fStore,
               (TPZVec<int> *)sideorient.super_TPZVec<int>._vptr_TPZVec,in_stack_000000b8);
    in_stack_fffffffffffffe68 =
         TPZShapeHDiv<pzshape::TPZShapeTetra>::NShapeF(in_stack_fffffffffffffe50);
    local_124 = in_stack_fffffffffffffe68;
  }
  else if (iVar2 == 1) {
    TPZShapeHDivConstant<pzshape::TPZShapeTetra>::Initialize
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    in_stack_fffffffffffffe64 =
         (*(in_RDI->super_TPZVec<std::pair<int,_long>_>)._vptr_TPZVec[0x4b])();
    local_124 = in_stack_fffffffffffffe64;
  }
  TPZFMatrix<double>::Resize(in_stack_fffffffffffffec8,(int64_t)in_RDI,(int64_t)newCols);
  TPZManVector<std::pair<int,_long>,_20>::Resize(in_RDI,(int64_t)newCols);
  for (local_128 = 0; local_128 < local_124; local_128 = local_128 + 1) {
    pdVar6 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe70,CONCAT44(iVar2,in_stack_fffffffffffffe68),
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    *pdVar6 = 1.0;
    std::pair<int,_long>::pair<int_&,_int_&,_true>
              ((pair<int,_long> *)&stack0xfffffffffffffec8,&local_128,&local_128);
    in_stack_fffffffffffffe50 =
         (TPZShapeData *)
         TPZVec<std::pair<int,_long>_>::operator[]
                   ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_128);
    std::pair<int,_long>::operator=
              ((pair<int,_long> *)in_stack_fffffffffffffe50,(type)&stack0xfffffffffffffec8);
  }
  *(undefined4 *)(local_10 + 8) = 3;
  TPZManVector<int,_4>::~TPZManVector((TPZManVector<int,_4> *)in_stack_fffffffffffffe50);
  TPZManVector<int,_15>::~TPZManVector((TPZManVector<int,_15> *)in_stack_fffffffffffffe50);
  TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}